

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O2

QSize __thiscall
QPixmapStyle::comboBoxSizeFromContents
          (QPixmapStyle *this,QStyleOption *option,QSize *contentsSize,QWidget *widget)

{
  QSize QVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  ControlDescriptor local_6c;
  QPixmapStyleDescriptor local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_6c = DD_ButtonEnabled;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
            (&local_68,
             (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)
             (*(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8 + 0xe8),&local_6c);
  QVar1 = QCommonStyle::sizeFromContents
                    (&this->super_QCommonStyle,CT_ComboBox,option,contentsSize,widget);
  uVar2 = (ulong)(uint)local_68.size.wd.m_i;
  if (local_68.size.wd.m_i <= QVar1.wd.m_i.m_i) {
    uVar2 = (ulong)QVar1 & 0xffffffff;
  }
  if (local_68.tileRules.horizontal == RepeatTile) {
    uVar2 = (ulong)QVar1 & 0xffffffff;
  }
  uVar3 = (ulong)(uint)local_68.size.ht.m_i;
  if (local_68.size.ht.m_i <= QVar1.ht.m_i.m_i) {
    uVar3 = (ulong)QVar1 >> 0x20;
  }
  if (local_68.tileRules.vertical == RepeatTile) {
    uVar3 = (ulong)(uint)QVar1.ht.m_i.m_i;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSize)(uVar2 | uVar3 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QPixmapStyle::comboBoxSizeFromContents(const QStyleOption *option,
                                             const QSize &contentsSize,
                                             const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    const QPixmapStyleDescriptor &desc = d->descriptors.value(DD_ButtonEnabled);

    QSize result = QCommonStyle::sizeFromContents(CT_ComboBox, option, contentsSize, widget);
    return d->computeSize(desc, result.width(), result.height());
}